

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O3

void __thiscall FFlatVertexBuffer::FFlatVertexBuffer(FFlatVertexBuffer *this,int width,int height)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  FFlatVertex *pFVar4;
  
  bVar3 = gl.legacyMode;
  puVar1 = &(this->super_FVertexBuffer).vbo_id;
  (this->super_FVertexBuffer)._vptr_FVertexBuffer = (_func_int **)&PTR__FVertexBuffer_00869170;
  (this->super_FVertexBuffer).vbo_id = 0;
  if (!bVar3) {
    (*_ptrc_glGenBuffers)(1,puVar1);
  }
  (this->super_FVertexBuffer)._vptr_FVertexBuffer = (_func_int **)&PTR__FFlatVertexBuffer_00869198;
  (this->vbo_shadowdata).Array = (FFlatVertex *)0x0;
  (this->vbo_shadowdata).Most = 0;
  (this->vbo_shadowdata).Count = 0;
  if (gl.buffermethod == 1) {
    (*_ptrc_glBindBuffer)(0x8892,*puVar1);
    (*_ptrc_glBufferData)(0x8892,40000000,(void *)0x0,0x88e0);
    this->map = (FFlatVertex *)0x0;
    DPrintf(3,"Using deferred buffer\n");
  }
  else if (gl.buffermethod == 2) {
    (*_ptrc_glBindBuffer)(0x8892,*puVar1);
    (*_ptrc_glBufferStorage)(0x8892,40000000,(void *)0x0,0xc2);
    pFVar4 = (FFlatVertex *)(*_ptrc_glMapBufferRange)(0x8892,0,40000000,0xc2);
    this->map = pFVar4;
    DPrintf(3,"Using persistent buffer\n");
  }
  else {
    pFVar4 = (FFlatVertex *)operator_new__(40000000);
    this->map = pFVar4;
    DPrintf(3,"Using client array buffer\n");
  }
  this->mIndex = 0;
  this->mCurIndex = 0;
  this->mNumReserved = 0x14;
  uVar2 = (this->vbo_shadowdata).Count;
  if (uVar2 < 0x14) {
    TArray<FFlatVertex,_FFlatVertex>::Grow(&this->vbo_shadowdata,0x14 - uVar2);
  }
  (this->vbo_shadowdata).Count = 0x14;
  pFVar4 = (this->vbo_shadowdata).Array;
  pFVar4->x = 0.0;
  pFVar4->z = 0.0;
  pFVar4->y = 0.0;
  pFVar4->u = 0.0;
  *(undefined8 *)&pFVar4->v = 0x3f80000000000000;
  pFVar4[1].z = 0.0;
  pFVar4[1].y = 0.0;
  pFVar4[1].u = 0.0;
  pFVar4[1].v = 0.0;
  pFVar4[2].x = 2.0;
  pFVar4[2].z = 0.0;
  pFVar4[2].y = 0.0;
  pFVar4[2].u = 0.0;
  pFVar4[2].v = 0.0;
  pFVar4[3].x = 3.0;
  pFVar4[3].z = 0.0;
  pFVar4[3].y = 0.0;
  pFVar4[3].u = 0.0;
  pFVar4[3].v = 0.0;
  pFVar4[4].x = 0.0;
  pFVar4[4].z = 0.0;
  pFVar4[4].y = 0.0;
  pFVar4[4].u = 0.0;
  *(undefined8 *)&pFVar4[4].v = 0;
  pFVar4[5].z = (float)height;
  pFVar4[5].y = 0.0;
  pFVar4[5].u = 0.0;
  pFVar4[5].v = 0.0;
  pFVar4[6].x = (float)width;
  pFVar4[6].z = 0.0;
  pFVar4[6].y = 0.0;
  pFVar4[6].u = 0.0;
  pFVar4[6].v = 0.0;
  pFVar4[7].x = (float)width;
  pFVar4[7].z = (float)height;
  pFVar4[7].y = 0.0;
  pFVar4[7].u = 0.0;
  *(undefined8 *)&pFVar4[7].v = 0xbf80000000000000;
  pFVar4[8].z = -1.0;
  pFVar4[8].y = 0.0;
  pFVar4[8].u = 0.0;
  pFVar4[8].v = 0.0;
  pFVar4[9].x = -1.0;
  pFVar4[9].z = 1.0;
  pFVar4[9].y = 0.0;
  pFVar4[9].u = 0.0;
  *(undefined8 *)&pFVar4[9].v = 0x3f8000003f800000;
  pFVar4[10].z = -1.0;
  pFVar4[10].y = 0.0;
  pFVar4[10].u = 1.0;
  pFVar4[10].v = 0.0;
  pFVar4[0xb].x = 1.0;
  pFVar4[0xb].z = 1.0;
  pFVar4[0xb].y = 0.0;
  pFVar4[0xb].u = 1.0;
  *(undefined8 *)&pFVar4[0xb].v = 0xc6fffe003f800000;
  pFVar4[0xc].z = 32767.0;
  pFVar4[0xc].y = -32767.0;
  pFVar4[0xc].u = 0.0;
  pFVar4[0xc].v = 0.0;
  pFVar4[0xd].x = -32767.0;
  pFVar4[0xd].z = 32767.0;
  pFVar4[0xd].y = 32767.0;
  pFVar4[0xd].u = 0.0;
  *(undefined8 *)&pFVar4[0xd].v = 0x46fffe0000000000;
  pFVar4[0xe].z = 32767.0;
  pFVar4[0xe].y = 32767.0;
  pFVar4[0xe].u = 0.0;
  pFVar4[0xe].v = 0.0;
  pFVar4[0xf].x = 32767.0;
  pFVar4[0xf].z = 32767.0;
  pFVar4[0xf].y = -32767.0;
  pFVar4[0xf].u = 0.0;
  *(undefined8 *)&pFVar4[0xf].v = 0xc6fffe0000000000;
  pFVar4[0x10].z = -32767.0;
  pFVar4[0x10].y = -32767.0;
  pFVar4[0x10].u = 0.0;
  pFVar4[0x10].v = 0.0;
  pFVar4[0x11].x = -32767.0;
  pFVar4[0x11].z = -32767.0;
  pFVar4[0x11].y = 32767.0;
  pFVar4[0x11].u = 0.0;
  *(undefined8 *)&pFVar4[0x11].v = 0x46fffe0000000000;
  pFVar4[0x12].z = -32767.0;
  pFVar4[0x12].y = 32767.0;
  pFVar4[0x12].u = 0.0;
  pFVar4[0x12].v = 0.0;
  pFVar4[0x13].x = 32767.0;
  pFVar4[0x13].z = -32767.0;
  pFVar4[0x13].y = -32767.0;
  pFVar4[0x13].u = 0.0;
  pFVar4[0x13].v = 0.0;
  if (gl.buffermethod == 1) {
    (*_ptrc_glBindBuffer)(0x8892,*puVar1);
    gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
    pFVar4 = (FFlatVertex *)(*_ptrc_glMapBufferRange)(0x8892,0,40000000,0x22);
    this->map = pFVar4;
    memcpy(pFVar4,(this->vbo_shadowdata).Array,(ulong)this->mNumReserved * 0x14);
    if (gl.buffermethod == 1) {
      (*_ptrc_glBindBuffer)(0x8892,*puVar1);
      gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
      (*_ptrc_glUnmapBuffer)(0x8892);
      this->map = (FFlatVertex *)0x0;
    }
  }
  return;
}

Assistant:

FFlatVertexBuffer::FFlatVertexBuffer(int width, int height)
: FVertexBuffer(!gl.legacyMode)
{
	switch (gl.buffermethod)
	{
	case BM_PERSISTENT:
	{
		unsigned int bytesize = BUFFER_SIZE * sizeof(FFlatVertex);
		glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
		glBufferStorage(GL_ARRAY_BUFFER, bytesize, NULL, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		map = (FFlatVertex*)glMapBufferRange(GL_ARRAY_BUFFER, 0, bytesize, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		DPrintf(DMSG_NOTIFY, "Using persistent buffer\n");
		break;
	}

	case BM_DEFERRED:
	{
		unsigned int bytesize = BUFFER_SIZE * sizeof(FFlatVertex);
		glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
		glBufferData(GL_ARRAY_BUFFER, bytesize, NULL, GL_STREAM_DRAW);
		map = nullptr;
		DPrintf(DMSG_NOTIFY, "Using deferred buffer\n");
		break;
	}

	default:
	{
		map = new FFlatVertex[BUFFER_SIZE];
		DPrintf(DMSG_NOTIFY, "Using client array buffer\n");
		break;
	}
	}
	mIndex = mCurIndex = 0;
	mNumReserved = NUM_RESERVED;
	vbo_shadowdata.Resize(mNumReserved);

	// the first quad is reserved for handling coordinates through uniforms.
	vbo_shadowdata[0].Set(0, 0, 0, 0, 0);
	vbo_shadowdata[1].Set(1, 0, 0, 0, 0);
	vbo_shadowdata[2].Set(2, 0, 0, 0, 0);
	vbo_shadowdata[3].Set(3, 0, 0, 0, 0);

	// and the second one for the fullscreen quad used for blend overlays.
	vbo_shadowdata[4].Set(0, 0, 0, 0, 0);
	vbo_shadowdata[5].Set(0, (float)height, 0, 0, 0);
	vbo_shadowdata[6].Set((float)width, 0, 0, 0, 0);
	vbo_shadowdata[7].Set((float)width, (float)height, 0, 0, 0);

	// and this is for the postprocessing copy operation
	vbo_shadowdata[8].Set(-1.0f, -1.0f, 0, 0.0f, 0.0f);
	vbo_shadowdata[9].Set(-1.0f, 1.0f, 0, 0.0f, 1.f);
	vbo_shadowdata[10].Set(1.0f, -1.0f, 0, 1.f, 0.0f);
	vbo_shadowdata[11].Set(1.0f, 1.0f, 0, 1.f, 1.f);

	// The next two are the stencil caps.
	vbo_shadowdata[12].Set(-32767.0f, 32767.0f, -32767.0f, 0, 0);
	vbo_shadowdata[13].Set(-32767.0f, 32767.0f, 32767.0f, 0, 0);
	vbo_shadowdata[14].Set(32767.0f, 32767.0f, 32767.0f, 0, 0);
	vbo_shadowdata[15].Set(32767.0f, 32767.0f, -32767.0f, 0, 0);

	vbo_shadowdata[16].Set(-32767.0f, -32767.0f, -32767.0f, 0, 0);
	vbo_shadowdata[17].Set(-32767.0f, -32767.0f, 32767.0f, 0, 0);
	vbo_shadowdata[18].Set(32767.0f, -32767.0f, 32767.0f, 0, 0);
	vbo_shadowdata[19].Set(32767.0f, -32767.0f, -32767.0f, 0, 0);

	if (gl.buffermethod == BM_DEFERRED)
	{
		Map();
		memcpy(map, &vbo_shadowdata[0], mNumReserved * sizeof(FFlatVertex));
		Unmap();
	}

}